

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools_common.c
# Opt level: O2

char * get_short_name_by_aom_encoder(aom_codec_iface_t *iface)

{
  aom_codec_iface_t *paVar1;
  char *pcVar2;
  
  paVar1 = aom_codec_av1_cx();
  pcVar2 = (char *)0x0;
  if (paVar1 == iface) {
    pcVar2 = "av1";
  }
  return pcVar2;
}

Assistant:

const char *get_short_name_by_aom_encoder(aom_codec_iface_t *iface) {
  for (int i = 0; i < get_aom_encoder_count(); ++i) {
    const struct CodecInfo *info = &aom_encoders[i];
    if (info->interface() == iface) {
      return info->short_name;
    }
  }
  return NULL;
}